

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

flatcc_builder_ref_t flatcc_builder_end_vector(flatcc_builder_t *B)

{
  __flatcc_builder_frame_t *p_Var1;
  flatcc_builder_ref_t fVar2;
  
  p_Var1 = B->frame;
  if (p_Var1->type == 4) {
    fVar2 = flatcc_builder_create_vector
                      (B,B->ds,(ulong)(p_Var1->container).table.pl_end,
                       (ulong)(p_Var1->container).table.vs_end,B->align,
                       (ulong)(p_Var1->container).table.vt_hash);
    if (fVar2 != 0) {
      exit_frame(B);
    }
    return fVar2;
  }
  __assert_fail("(B->frame[0].type) == flatcc_builder_vector",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x595,"flatcc_builder_ref_t flatcc_builder_end_vector(flatcc_builder_t *)");
}

Assistant:

flatcc_builder_ref_t flatcc_builder_end_vector(flatcc_builder_t *B)
{
    flatcc_builder_ref_t vector_ref;

    check(frame(type) == flatcc_builder_vector, "expected vector frame");

    if (0 == (vector_ref = flatcc_builder_create_vector(B, B->ds,
            frame(container.vector.count), frame(container.vector.elem_size),
            B->align, frame(container.vector.max_count)))) {
        return 0;
    }
    exit_frame(B);
    return vector_ref;
}